

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O1

string * __thiscall wabt::Type::GetName_abi_cxx11_(string *__return_storage_ptr__,Type *this)

{
  Enum EVar1;
  char *pcVar2;
  char *pcVar3;
  
  EVar1 = this->enum_;
  switch(EVar1) {
  case Any:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "any";
    pcVar2 = "";
    break;
  case Reference:
    EVar1 = this->type_index_;
    pcVar2 = "(ref %d)";
    goto LAB_0012dda3;
  case ExternRef:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "externref";
    pcVar2 = "";
    break;
  case FuncRef:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "funcref";
    pcVar2 = "";
    break;
  case I16:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "i16";
    pcVar2 = "";
    break;
  case I8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "i8";
    pcVar2 = "";
    break;
  case V128:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "v128";
    pcVar2 = "";
    break;
  case F64:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "f64";
    pcVar2 = "";
    break;
  case F32:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "f32";
    pcVar2 = "";
    break;
  case I64:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "i64";
    pcVar2 = "";
    break;
  case I32:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "i32";
    pcVar2 = "";
    break;
  default:
    if (EVar1 == Void) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "void";
      pcVar2 = "";
      break;
    }
    if (EVar1 == Func) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "func";
      pcVar2 = "";
      break;
    }
  case 0xffffffec:
  case 0xffffffed:
  case 0xffffffee:
  case 0xfffffff1:
  case 0xfffffff2:
  case 0xfffffff3:
  case FuncRef|I8U:
  case 0xfffffff5:
  case FuncRef|I16U:
  case FuncRef|I32U:
  case ~I32U:
    pcVar2 = "<type_index[%d]>";
LAB_0012dda3:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,pcVar2,(ulong)(uint)EVar1);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GetName() const {
    switch (enum_) {
      case Type::I32:       return "i32";
      case Type::I64:       return "i64";
      case Type::F32:       return "f32";
      case Type::F64:       return "f64";
      case Type::V128:      return "v128";
      case Type::I8:        return "i8";
      case Type::I16:       return "i16";
      case Type::FuncRef:   return "funcref";
      case Type::Func:      return "func";
      case Type::Void:      return "void";
      case Type::Any:       return "any";
      case Type::ExternRef: return "externref";
      case Type::Reference:
        return StringPrintf("(ref %d)", type_index_);
      default:
        return StringPrintf("<type_index[%d]>", enum_);
    }
  }